

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O1

ParserString GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,bool *failed)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  ParserString PVar7;
  
  pbVar4 = (byte *)*buffer;
  if (pbVar4 == (byte *)0x0) {
    *failed = true;
    return (UnionString)ZEXT816(0);
  }
  if (*pbVar4 == 0) {
    *failed = true;
  }
  else {
    do {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) {
        pbVar3 = (byte *)0x0;
        sVar5 = 0;
        bVar2 = false;
        goto LAB_0082d818;
      }
      pbVar3 = pbVar4 + 1;
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar3;
    } while (*pbVar1 != 0);
    *failed = true;
    *buffer = (ParserChar *)pbVar3;
  }
LAB_0082d805:
  pbVar3 = (byte *)0x0;
  sVar5 = 0;
LAB_0082d809:
  PVar7.super_UnionString.length = sVar5;
  PVar7.super_UnionString.str = (ParserChar *)pbVar3;
  return (ParserString)PVar7.super_UnionString;
LAB_0082d818:
  pbVar1 = pbVar4 + sVar5;
  uVar6 = (ulong)pbVar4[sVar5];
  if (uVar6 < 0x21) {
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0) {
      if (!bVar2) goto LAB_0082d862;
      *buffer = (ParserChar *)pbVar1;
      *failed = false;
      goto LAB_0082d809;
    }
    if (uVar6 == 0) goto LAB_0082d854;
  }
  if (!bVar2) {
    bVar2 = true;
    pbVar3 = pbVar1;
  }
  sVar5 = sVar5 + 1;
  goto LAB_0082d818;
LAB_0082d854:
  if (bVar2) {
    *failed = false;
    *buffer = (ParserChar *)pbVar1;
    goto LAB_0082d809;
  }
LAB_0082d862:
  *failed = true;
  *buffer = (ParserChar *)pbVar1;
  goto LAB_0082d805;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( *s == '\0' )
        {
            failed = true;
            *buffer = s;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( *s == '\0' )
            {
                failed = true;
                *buffer = s;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( *s == '\0' )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }